

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O3

void __thiscall SBLA::FirstScan(SBLA *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  Mat1b *pMVar4;
  char *pcVar5;
  Mat1i *pMVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  bool bVar30;
  ulong local_110;
  ulong local_100;
  long local_f0;
  long local_e8;
  long local_e0;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar26 = *(int *)&pMVar4->field_0xc;
  this->N = iVar26;
  iVar10 = *(int *)&pMVar4->field_0x8;
  this->M = iVar10;
  cv::Mat::Mat(local_90,iVar10,iVar26,4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pcVar5 = *(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10;
  cVar2 = *pcVar5;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = cVar2;
  if (cVar2 == '\0') {
    uVar19 = (ulong)(uint)this->N;
    goto LAB_001e0d1b;
  }
  *pcVar5 = '\0';
  uVar13 = this->N;
  uVar19 = (ulong)uVar13;
  if (this->M == 1) {
    if (uVar13 != 1) {
      cVar2 = *(char *)(*(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0x10 + 1);
LAB_001e0cf9:
      uVar13 = (uint)(cVar2 == '\0');
LAB_001e0d17:
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
      goto LAB_001e0d1b;
    }
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 1;
  }
  else {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar27 = *(long *)&pMVar4->field_0x10;
    if (uVar13 != 1) {
      uVar13 = 0;
      if ((*(char *)(lVar27 + 1) == '\0') &&
         (*(char *)(lVar27 + **(long **)&pMVar4->field_0x48) == '\0')) {
        cVar2 = *(char *)(lVar27 + 1 + **(long **)&pMVar4->field_0x48);
        goto LAB_001e0cf9;
      }
      goto LAB_001e0d17;
    }
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ =
         (uint)(*(char *)(lVar27 + **(long **)&pMVar4->field_0x48) == '\0');
  }
  uVar19 = 1;
LAB_001e0d1b:
  iVar26 = (int)uVar19;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar13 = *(uint *)&pMVar6->field_0x8;
  uVar15 = uVar13 & 0xfffffffe;
  if ((int)uVar15 < 1) {
    local_110 = 0;
    iVar10 = 0;
    lVar27 = 0;
  }
  else {
    iVar25 = iVar26 * 2;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    local_e0 = *(long *)&pMVar4->field_0x10;
    lVar24 = **(long **)&pMVar4->field_0x48;
    lVar7 = *(long *)&pMVar6->field_0x10;
    lVar8 = **(long **)&pMVar6->field_0x48;
    local_e8 = lVar7 + lVar8;
    local_f0 = local_e0 + lVar24;
    lVar24 = lVar24 * 2;
    local_110 = 0;
    iVar10 = 0;
    lVar18 = lVar7;
    lVar16 = 0;
    local_100 = uVar19;
    do {
      lVar17 = lVar8 * local_110 + lVar7;
      lVar27 = lVar17 + lVar8;
      if (0 < (int)uVar19) {
        lVar11 = 0;
        do {
          *(uint *)(lVar18 + lVar11 * 4) = (uint)*(byte *)(local_e0 + lVar11);
          *(uint *)(local_e8 + lVar11 * 4) = (uint)*(byte *)(local_f0 + lVar11);
          lVar11 = lVar11 + 1;
          uVar19 = (ulong)this->N;
        } while (lVar11 < (long)uVar19);
        if (0 < this->N) {
          iVar26 = 0;
          do {
            lVar11 = (long)iVar26;
            iVar9 = *(int *)(lVar17 + lVar11 * 4);
            if (*(int *)(lVar27 + lVar11 * 4) == 0) {
              iVar14 = iVar26;
              if (iVar9 != 0) {
                iVar21 = -(iVar10 + iVar26);
                goto LAB_001e0e4a;
              }
            }
            else {
              iVar21 = -((int)local_100 + iVar26);
              *(int *)(lVar27 + lVar11 * 4) = iVar21;
              if (iVar9 != 0) {
LAB_001e0e4a:
                *(int *)(lVar17 + lVar11 * 4) = iVar21;
              }
              iVar14 = iVar26 + 1;
              uVar19 = (ulong)(uint)this->N;
              iVar9 = iVar26;
              if (iVar14 < this->N) {
                lVar11 = lVar18 + (long)iVar14 * 4;
                lVar12 = 0;
                do {
                  iVar9 = *(int *)(lVar11 + lVar12 * 4);
                  if (*(int *)(lVar11 + lVar8 + lVar12 * 4) == 0) {
                    if (iVar9 == 0) break;
LAB_001e0e87:
                    *(int *)(lVar11 + lVar12 * 4) = iVar21;
                  }
                  else {
                    *(int *)(lVar11 + lVar8 + lVar12 * 4) = iVar21;
                    if (iVar9 != 0) goto LAB_001e0e87;
                  }
                  uVar19 = (ulong)this->N;
                  lVar1 = iVar14 + lVar12;
                  lVar12 = lVar12 + 1;
                } while (lVar1 + 1 < (long)uVar19);
                iVar14 = iVar14 + (int)lVar12;
                iVar9 = (int)lVar12 + iVar26;
              }
              if ((local_110 != 0) && (iVar26 <= iVar9)) {
                iVar20 = -0x80000000;
                do {
                  lVar11 = (long)iVar26;
                  iVar28 = iVar26;
                  if (*(int *)(lVar17 + lVar11 * 4) != 0) {
                    iVar22 = 1;
                    if (1 < iVar26) {
                      iVar22 = iVar26;
                    }
                    iVar22 = iVar22 + -1;
                    iVar29 = this->N;
                    iVar23 = iVar26 + 1;
                    if (iVar26 + 1 < iVar29) {
                      iVar23 = iVar29;
                    }
                    do {
                      lVar11 = lVar11 + 1;
                      iVar28 = iVar23;
                      if (iVar29 <= lVar11) break;
                      iVar26 = iVar26 + 1;
                      iVar28 = iVar26;
                    } while (*(int *)(lVar18 + lVar11 * 4) != 0);
                    iVar26 = iVar29 + -1;
                    if (iVar28 < iVar29 + -1) {
                      iVar26 = iVar28;
                    }
                    if (iVar22 <= iVar26) {
                      do {
                        iVar29 = *(int *)(lVar16 + (long)iVar22 * 4);
                        iVar23 = iVar22;
                        if (iVar29 != 0) {
                          do {
                            iVar23 = iVar29;
                            iVar29 = *(int *)(lVar7 + (long)-iVar23 * 4);
                          } while (iVar29 != iVar23);
                          iVar29 = iVar21;
                          if (iVar20 < iVar23) {
                            do {
                              iVar3 = *(int *)(lVar7 + (long)-iVar29 * 4);
                              iVar20 = iVar23;
                              if (iVar3 == iVar23) break;
                              *(int *)(lVar7 + (long)-iVar29 * 4) = iVar23;
                              bVar30 = iVar3 != iVar29;
                              iVar29 = iVar3;
                            } while (bVar30);
                          }
                          else if (iVar23 < iVar20) {
                            do {
                              iVar29 = *(int *)(lVar7 + (long)-iVar23 * 4);
                              if (iVar29 == iVar20) break;
                              *(int *)(lVar7 + (long)-iVar23 * 4) = iVar20;
                              bVar30 = iVar29 != iVar23;
                              iVar23 = iVar29;
                            } while (bVar30);
                          }
                          iVar23 = iVar22;
                          if (iVar22 <= iVar26) {
                            iVar23 = iVar26;
                          }
                          iVar23 = iVar23 + 1;
                          lVar11 = (long)iVar22;
                          do {
                            if (iVar26 <= lVar11) goto LAB_001e0faa;
                            lVar12 = lVar11 + 1;
                            lVar1 = lVar11 * 4;
                            lVar11 = lVar12;
                          } while (*(int *)(lVar16 + 4 + lVar1) != 0);
                          iVar23 = (int)lVar12;
                        }
LAB_001e0faa:
                        iVar22 = iVar23 + 1;
                      } while (iVar23 < iVar26);
                    }
                  }
                  iVar26 = iVar28 + 1;
                } while (iVar28 < iVar9);
                uVar19 = (ulong)(uint)this->N;
              }
            }
            iVar26 = iVar14 + 1;
          } while (iVar26 < (int)uVar19);
        }
      }
      iVar26 = (int)uVar19;
      iVar10 = iVar10 + iVar25;
      local_100 = (ulong)(uint)((int)local_100 + iVar25);
      local_110 = local_110 + 2;
      local_e8 = local_e8 + lVar8 * 2;
      local_f0 = local_f0 + lVar24;
      lVar18 = lVar18 + lVar8 * 2;
      local_e0 = local_e0 + lVar24;
      lVar16 = lVar27;
    } while (local_110 < uVar15);
  }
  if (((uVar13 & 0x80000001) == 1) && (0 < iVar26)) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar24 = **(long **)&pMVar4->field_0x48;
    lVar7 = *(long *)&pMVar4->field_0x10;
    lVar8 = *(long *)&pMVar6->field_0x10;
    lVar16 = (local_110 & 0xffffffff) * **(long **)&pMVar6->field_0x48 + lVar8;
    lVar18 = 0;
    do {
      *(uint *)(lVar16 + lVar18 * 4) =
           (uint)*(byte *)(lVar24 * (local_110 & 0xffffffff) + lVar7 + lVar18);
      lVar18 = lVar18 + 1;
      uVar19 = (ulong)this->N;
    } while (lVar18 < (long)uVar19);
    if (0 < this->N) {
      iVar26 = 0;
      do {
        iVar25 = iVar26;
        if (*(int *)(lVar16 + (long)iVar26 * 4) != 0) {
          iVar14 = -(iVar10 + iVar26);
          *(int *)(lVar16 + (long)iVar26 * 4) = iVar14;
          iVar25 = iVar26 + 1;
          uVar19 = (ulong)(uint)this->N;
          iVar9 = iVar26;
          if (iVar25 < this->N) {
            lVar24 = (long)iVar25;
            iVar21 = *(int *)(lVar16 + lVar24 * 4);
            while (iVar20 = iVar25, iVar25 = iVar20, iVar21 != 0) {
              lVar24 = lVar24 + 1;
              *(int *)(lVar16 + -4 + lVar24 * 4) = iVar14;
              uVar19 = (ulong)this->N;
              iVar25 = iVar20 + 1;
              iVar9 = iVar20;
              if ((long)uVar19 <= lVar24) break;
              iVar21 = *(int *)(lVar16 + lVar24 * 4);
            }
          }
          if (((int)local_110 != 0) && (iVar26 <= iVar9)) {
            iVar21 = -0x80000000;
            do {
              lVar24 = (long)iVar26;
              iVar20 = iVar26;
              if (*(int *)(lVar16 + lVar24 * 4) != 0) {
                iVar28 = 1;
                if (1 < iVar26) {
                  iVar28 = iVar26;
                }
                iVar28 = iVar28 + -1;
                iVar22 = this->N;
                iVar29 = iVar26 + 1;
                if (iVar26 + 1 < iVar22) {
                  iVar29 = iVar22;
                }
                do {
                  lVar24 = lVar24 + 1;
                  iVar20 = iVar29;
                  if (iVar22 <= lVar24) break;
                  iVar26 = iVar26 + 1;
                  iVar20 = iVar26;
                } while (*(int *)(lVar16 + lVar24 * 4) != 0);
                iVar26 = iVar22 + -1;
                if (iVar20 < iVar22 + -1) {
                  iVar26 = iVar20;
                }
                if (iVar28 <= iVar26) {
                  do {
                    iVar22 = *(int *)(lVar27 + (long)iVar28 * 4);
                    iVar29 = iVar28;
                    if (iVar22 != 0) {
                      do {
                        iVar29 = iVar22;
                        iVar22 = *(int *)(lVar8 + (long)-iVar29 * 4);
                      } while (iVar22 != iVar29);
                      iVar22 = iVar14;
                      if (iVar21 < iVar29) {
                        do {
                          iVar23 = *(int *)(lVar8 + (long)-iVar22 * 4);
                          iVar21 = iVar29;
                          if (iVar23 == iVar29) break;
                          *(int *)(lVar8 + (long)-iVar22 * 4) = iVar29;
                          bVar30 = iVar23 != iVar22;
                          iVar22 = iVar23;
                        } while (bVar30);
                      }
                      else if (iVar29 < iVar21) {
                        do {
                          iVar22 = *(int *)(lVar8 + (long)-iVar29 * 4);
                          if (iVar22 == iVar21) break;
                          *(int *)(lVar8 + (long)-iVar29 * 4) = iVar21;
                          bVar30 = iVar22 != iVar29;
                          iVar29 = iVar22;
                        } while (bVar30);
                      }
                      iVar29 = iVar28;
                      if (iVar28 <= iVar26) {
                        iVar29 = iVar26;
                      }
                      iVar29 = iVar29 + 1;
                      lVar24 = (long)iVar28;
                      do {
                        if (iVar26 <= lVar24) goto LAB_001e1225;
                        lVar7 = lVar24 + 1;
                        lVar18 = lVar24 * 4;
                        lVar24 = lVar7;
                      } while (*(int *)(lVar27 + 4 + lVar18) != 0);
                      iVar29 = (int)lVar7;
                    }
LAB_001e1225:
                    iVar28 = iVar29 + 1;
                  } while (iVar29 < iVar26);
                }
              }
              iVar26 = iVar20 + 1;
            } while (iVar20 < iVar9);
            uVar19 = (ulong)(uint)this->N;
          }
        }
        iVar26 = iVar25 + 1;
      } while (iVar26 < (int)uVar19);
    }
  }
  return;
}

Assistant:

void FirstScan()
    {
        N = img_.cols;
        M = img_.rows;
        img_labels_ = cv::Mat1i(M, N);

        // Fix for first pixel!
        n_labels_ = 0;
        firstpixel = img_.data[0];
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = 0;

            if (M == 1) {
                if (N == 1)
                    n_labels_ = 1;
                else
                    n_labels_ = img_.data[1] == 0;
            }
            else {
                if (N == 1)
                    n_labels_ = img_.data[img_.step[0]] == 0;
                else
                    n_labels_ = img_.data[1] == 0 && img_.data[img_.step[0]] == 0 && img_.data[img_.step[0] + 1] == 0;
            }
        }

        // Stripe extraction and representation
        unsigned int* img_labels_row_prev = nullptr;
        int rN = 0;
        int r1N = N;
        int N2 = N * 2;

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
                img_labels_row_fol[c] = img_row_fol[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];
                int oddpix = img_labels_row_fol[c];

                // Step 2
                int Gp;
                if (oddpix) {
                    img_labels_row_fol[c] = Gp = -(r1N + c);
                    if (evenpix)
                        img_labels_row[c] = Gp;
                }
                else if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];
                    int oddpix = img_labels_row_fol[c];

                    if (oddpix) {
                        img_labels_row_fol[c] = Gp;
                        if (evenpix)
                            img_labels_row[c] = Gp;
                    }
                    else if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
            img_labels_row_prev = img_labels_row_fol;
            rN += N2;
            r1N += N2;
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            for (int c = 0; c < N; ++c) {
                img_labels_row[c] = img_row[c];
            }

            for (int c = 0; c < N; ++c) {
                // Step 1
                int evenpix = img_labels_row[c];

                // Step 2
                int Gp;
                if (evenpix)
                    img_labels_row[c] = Gp = -(rN + c);
                else
                    continue;

                // Step 3
                int stripestart = c;
                while (++c < N) {
                    int evenpix = img_labels_row[c];

                    if (evenpix)
                        img_labels_row[c] = Gp;
                    else
                        break;
                }
                int stripestop = c;

                if (r == 0)
                    continue;

                // Stripe union
                int lastroot = INT_MIN;
                for (int i = stripestart; i < stripestop; ++i) {
                    int linepix = img_labels_row[i];
                    if (!linepix)
                        continue;

                    int runstart = std::max(0, i - 1);
                    do
                        i++;
                    while (i < N && img_labels_row[i]);
                    int runstop = std::min(N - 1, i);

                    for (int j = runstart; j <= runstop; ++j) {
                        int curpix = img_labels_row_prev[j];
                        if (!curpix)
                            continue;

                        int newroot = FindRoot(reinterpret_cast<int*>(img_labels_.data), curpix);
                        if (newroot > lastroot) {
                            lastroot = newroot;
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), Gp, lastroot);
                        }
                        else if (newroot < lastroot) {
                            FindRootAndCompress(reinterpret_cast<int*>(img_labels_.data), newroot, lastroot);
                        }

                        do
                            ++j;
                        while (j <= runstop && img_labels_row_prev[j]);
                    }
                }
            }
        }
    }